

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesPathWidget.cxx
# Opt level: O3

void __thiscall
cmCursesPathWidget::OnType(cmCursesPathWidget *this,int *key,cmCursesMainForm *fm,WINDOW *w)

{
  this->Cycle = false;
  this->CurrentIndex = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->LastGlob,0,(char *)(this->LastGlob)._M_string_length,0x51f1de);
  cmCursesStringWidget::OnType(&this->super_cmCursesStringWidget,key,fm,w);
  return;
}

Assistant:

void cmCursesPathWidget::OnType(int& key, cmCursesMainForm* fm, WINDOW* w)
{
  this->Cycle = false;
  this->CurrentIndex = 0;
  this->LastGlob = "";
  this->cmCursesStringWidget::OnType(key, fm, w);
}